

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common_v2.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::Finalize(idx2_file_v2 *Idx2)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  array<idx2::array<signed_char>_> *Array;
  long *plVar3;
  byte bVar4;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  i64 iVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  char *pcVar18;
  size_t __maxlen;
  idx2_err_code Enum;
  uint uVar19;
  undefined4 uVar20;
  ulong uVar21;
  long lVar22;
  long *in_FS_OFFSET;
  bool bVar23;
  stref sVar24;
  error<idx2::idx2_err_code> eVar25;
  int aiStackY_248 [104];
  char *local_98;
  undefined8 local_88;
  array<signed_char> local_78;
  int local_48 [6];
  
  pbVar5 = (Idx2->Dimensions).Buffer.Data;
  uVar20 = 0x36;
  pbVar17 = pbVar5;
  for (lVar15 = 0; (Idx2->Dimensions).Size * 0x38 - lVar15 != 0; lVar15 = lVar15 + 0x38) {
    lVar6 = *(long *)(pbVar17 + 0x18);
    if (lVar6 == 0) {
      iVar9 = *(int *)(pbVar5 + lVar15 + 0x30);
      if (iVar9 != 0) goto LAB_00105586;
      local_88 = 0x10102;
      Enum = SizeZero;
      local_98 = "Dimension %c is zero\n";
LAB_00105934:
      lVar6 = *in_FS_OFFSET;
      *(char **)(lVar6 + -0x300) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      lVar10 = *in_FS_OFFSET;
      *(undefined4 *)(lVar10 + -0x100) = uVar20;
      sVar24 = ToString(Enum);
      lVar13 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar13 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,uVar20);
      snprintf((char *)(lVar13 + -0x700) + iVar9,0x400 - (long)iVar9,local_98,
               (ulong)(uint)(int)(char)pbVar5[lVar15 + 0x34]);
      *(undefined4 *)(lVar10 + -0xfc) = 0xc6;
      *(char **)(lVar6 + -0x2f8) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      goto LAB_00105cca;
    }
    iVar9 = *(int *)(pbVar5 + lVar15 + 0x30);
    if (lVar6 < 1) {
LAB_00105586:
      if (iVar9 == 1) {
LAB_0010585e:
        local_88 = 0x10114;
        Enum = DimensionTooSmall;
        uVar20 = 0x3a;
        local_98 = "Dimension %c is too small (1), consider removing it\n";
        goto LAB_00105934;
      }
    }
    else {
      if (0 < iVar9) {
        local_88 = 0x10113;
        Enum = DimensionsRepeated;
        uVar20 = 0x38;
        local_98 = "Dimension %c is both numerical and categorical\n";
        goto LAB_00105934;
      }
      if (lVar6 == 1) goto LAB_0010585e;
    }
    pbVar17 = pbVar17 + 0x38;
  }
  lVar15 = *in_FS_OFFSET;
  puVar1 = (undefined8 *)(lVar15 + -0x300);
  *puVar1 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  lVar6 = *in_FS_OFFSET;
  puVar2 = (undefined4 *)(lVar6 + -0x100);
  *puVar2 = 0x3d;
  Mallocator();
  Mallocator();
  local_78.Buffer.Data = (byte *)0x0;
  local_78.Buffer.Bytes = 0;
  local_78.Buffer.Alloc = &Mallocator::Instance.super_allocator;
  local_78.Size = 0;
  local_78.Capacity = 0;
  local_78.Alloc = &Mallocator::Instance.super_allocator;
  uVar16 = (ulong)(uint)(Idx2->IdxTemplate).Full.Size;
  Array = &(Idx2->IdxTemplate).Suffix;
  bVar23 = true;
  while (0 < (int)uVar16) {
    if ((Idx2->IdxTemplate).Full.Size < (int)uVar16) {
      __assert_fail("Idx < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../String.h"
                    ,0x9b,"char &idx2::stref::operator[](int) const");
    }
    uVar16 = uVar16 - 1;
    bVar4 = (Idx2->IdxTemplate).Full.field_0.Ptr[uVar16];
    if (bVar4 == ':') {
      if (!bVar23) {
        *puVar1 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar2 = 0x52;
        sVar24 = ToString(SyntaxError);
        lVar10 = *in_FS_OFFSET;
        iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                         (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                         ,0x52);
        lVar13 = (long)iVar9;
        pcVar18 = (char *)(lVar10 + -0x700) + lVar13;
        local_98 = ": cannot occur after | in the indexing template\n";
        goto LAB_00105c9f;
      }
      lVar10 = (Idx2->IdxTemplate).Suffix.Size;
      if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar10) {
        GrowCapacity<idx2::array<signed_char>>(Array,0);
        lVar10 = (Idx2->IdxTemplate).Suffix.Size;
      }
      (Idx2->IdxTemplate).Suffix.Size = lVar10 + 1;
      pbVar5 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
      plVar3 = (long *)(pbVar5 + lVar10 * 0x30 + 0x10);
      *plVar3 = (long)local_78.Buffer.Alloc;
      plVar3[1] = local_78.Size;
      plVar3[2] = local_78.Capacity;
      plVar3[3] = (long)local_78.Alloc;
      plVar3 = (long *)(pbVar5 + lVar10 * 0x30);
      *plVar3 = (long)local_78.Buffer.Data;
      plVar3[1] = local_78.Buffer.Bytes;
      plVar3[2] = (long)local_78.Buffer.Alloc;
      plVar3[3] = local_78.Size;
      Mallocator();
      Mallocator();
      local_78.Buffer.Data = (byte *)0x0;
      local_78.Buffer.Bytes = 0;
      local_78.Buffer.Alloc = &Mallocator::Instance.super_allocator;
      local_78.Size = 0;
      local_78.Capacity = 0;
      local_78.Alloc = &Mallocator::Instance.super_allocator;
    }
    else if (bVar4 == '|') {
      if (!bVar23) {
        *puVar1 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar2 = 0x5a;
        sVar24 = ToString(SyntaxError);
        lVar10 = *in_FS_OFFSET;
        iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                         (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                         ,0x5a);
        lVar13 = (long)iVar9;
        pcVar18 = (char *)(lVar10 + -0x700) + lVar13;
        local_98 = "Only one | allowed in the indexing template\n";
        goto LAB_00105c9f;
      }
      lVar10 = (Idx2->IdxTemplate).Suffix.Size;
      if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar10) {
        GrowCapacity<idx2::array<signed_char>>(Array,0);
        lVar10 = (Idx2->IdxTemplate).Suffix.Size;
      }
      (Idx2->IdxTemplate).Suffix.Size = lVar10 + 1;
      pbVar5 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
      plVar3 = (long *)(pbVar5 + lVar10 * 0x30 + 0x10);
      *plVar3 = (long)local_78.Buffer.Alloc;
      plVar3[1] = local_78.Size;
      plVar3[2] = local_78.Capacity;
      plVar3[3] = (long)local_78.Alloc;
      plVar3 = (long *)(pbVar5 + lVar10 * 0x30);
      *plVar3 = (long)local_78.Buffer.Data;
      plVar3[1] = local_78.Buffer.Bytes;
      plVar3[2] = (long)local_78.Buffer.Alloc;
      plVar3[3] = local_78.Size;
      Mallocator();
      Mallocator();
      local_78.Buffer.Data = (byte *)0x0;
      local_78.Buffer.Bytes = 0;
      local_78.Buffer.Alloc = &Mallocator::Instance.super_allocator;
      local_78.Size = 0;
      local_78.Capacity = 0;
      local_78.Alloc = &Mallocator::Instance.super_allocator;
      bVar23 = false;
    }
    else {
      uVar19 = (uint)(char)bVar4;
      iVar9 = isalpha(uVar19);
      if ((iVar9 == 0) || (iVar9 = islower(uVar19), iVar9 == 0)) {
        *puVar1 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
        ;
        *puVar2 = 100;
        sVar24 = ToString(SyntaxError);
        lVar10 = *in_FS_OFFSET;
        iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                         (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                         ,100);
        local_98 = "Unsupported character (%c) in the indexing template\n";
        snprintf((char *)(lVar10 + -0x700) + iVar9,0x400 - (long)iVar9,
                 "Unsupported character (%c) in the indexing template\n",(ulong)uVar19);
        goto LAB_00105ca9;
      }
      bVar8 = Idx2->CharToIntMap[(long)(char)bVar4 + -0x61];
      if (bVar8 == 0xff) {
        lVar10 = (Idx2->Dimensions).Size;
        if (lVar10 < 1) {
          lVar10 = 0;
        }
        lVar13 = 0x34;
        lVar11 = 0;
        while( true ) {
          if (-lVar11 == lVar10) goto LAB_00105878;
          if (bVar4 == (Idx2->Dimensions).Buffer.Data[lVar13]) break;
          lVar11 = lVar11 + -1;
          lVar13 = lVar13 + 0x38;
        }
        bVar8 = -(char)lVar11;
        Idx2->CharToIntMap[(long)(char)bVar4 + -0x61] = bVar8;
        if ((char)lVar11 == '\x01') {
LAB_00105878:
          *puVar1 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
          ;
          *puVar2 = 0x78;
          sVar24 = ToString(DimensionsTooMany);
          lVar10 = *in_FS_OFFSET;
          iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                           (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                           ,0x78);
          pcVar18 = (char *)(lVar10 + -0x700) + iVar9;
          __maxlen = 0x400 - (long)iVar9;
          local_98 = "The indexing template contains an unknown dimension: %c\n";
          uVar16 = (ulong)uVar19;
          goto LAB_001058fa;
        }
      }
      if (bVar23) {
        iVar12 = local_78.Size;
        if (local_78.Capacity <= local_78.Size) {
          GrowCapacity<signed_char>(&local_78,0);
          bVar8 = Idx2->CharToIntMap[(long)(char)bVar4 + -0x61];
          iVar12 = local_78.Size;
        }
        local_78.Size = iVar12 + 1;
        local_78.Buffer.Data[iVar12] = bVar8;
      }
      else {
        lVar10 = (Idx2->IdxTemplate).Prefix.Size;
        if ((Idx2->IdxTemplate).Prefix.Capacity <= lVar10) {
          GrowCapacity<signed_char>(&(Idx2->IdxTemplate).Prefix,0);
          bVar8 = Idx2->CharToIntMap[(long)(char)bVar4 + -0x61];
          lVar10 = (Idx2->IdxTemplate).Prefix.Size;
        }
        (Idx2->IdxTemplate).Prefix.Size = lVar10 + 1;
        (Idx2->IdxTemplate).Prefix.Buffer.Data[lVar10] = bVar8;
      }
    }
  }
  if (0 < local_78.Size) {
    lVar10 = (Idx2->IdxTemplate).Suffix.Size;
    if ((Idx2->IdxTemplate).Suffix.Capacity <= lVar10) {
      GrowCapacity<idx2::array<signed_char>>(Array,0);
      lVar10 = (Idx2->IdxTemplate).Suffix.Size;
    }
    (Idx2->IdxTemplate).Suffix.Size = lVar10 + 1;
    pbVar5 = (Idx2->IdxTemplate).Suffix.Buffer.Data;
    plVar3 = (long *)(pbVar5 + lVar10 * 0x30 + 0x10);
    *plVar3 = (long)local_78.Buffer.Alloc;
    plVar3[1] = local_78.Size;
    plVar3[2] = local_78.Capacity;
    plVar3[3] = (long)local_78.Alloc;
    plVar3 = (long *)(pbVar5 + lVar10 * 0x30);
    *plVar3 = (long)local_78.Buffer.Data;
    plVar3[1] = local_78.Buffer.Bytes;
    plVar3[2] = (long)local_78.Buffer.Alloc;
    plVar3[3] = local_78.Size;
    if (0 < (Idx2->IdxTemplate).Prefix.Size) {
      *puVar1 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      *puVar2 = 0x87;
      sVar24 = ToString(SyntaxError);
      lVar10 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,0x87);
      lVar13 = (long)iVar9;
      pcVar18 = (char *)(lVar10 + -0x700) + lVar13;
      local_98 = "Invalid indexing template syntax\n";
LAB_00105c9f:
      snprintf(pcVar18,0x400 - lVar13,local_98);
LAB_00105ca9:
      local_88 = 0x1011e;
      goto LAB_00105cae;
    }
  }
  lVar10 = (Idx2->Dimensions).Size;
  lVar13 = 0;
  if (0 < lVar10) {
    lVar13 = lVar10;
  }
  lVar10 = lVar13 + 1;
  lVar11 = 0x34;
  do {
    lVar10 = lVar10 + -1;
    if (lVar10 == 0) {
      lVar10 = (Idx2->IdxTemplate).Suffix.Size;
      lVar11 = 0;
      if (lVar10 < 1) {
        lVar10 = lVar11;
      }
      goto LAB_00105ced;
    }
    uVar16 = (ulong)(char)(Idx2->Dimensions).Buffer.Data[lVar11];
    lVar11 = lVar11 + 0x38;
  } while (Idx2->CharToIntMap[uVar16 - 0x61] != -1);
  *puVar1 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  *puVar2 = 0x8f;
  sVar24 = ToString(DimensionsTooMany);
  lVar10 = *in_FS_OFFSET;
  iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                   (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                   ,0x8f);
  pcVar18 = (char *)(lVar10 + -0x700) + iVar9;
  __maxlen = 0x400 - (long)iVar9;
  local_98 = "Dimension %c does not appear in the indexing template\n";
  uVar16 = uVar16 & 0xffffffff;
LAB_001058fa:
  snprintf(pcVar18,__maxlen,local_98,uVar16);
  local_88 = 0x10106;
  goto LAB_00105cae;
LAB_00105ced:
  bVar23 = lVar10 == 0;
  lVar10 = lVar10 + -1;
  if (bVar23) goto LAB_00105d61;
  pbVar5 = (Array->Buffer).Data;
  lVar22 = *(long *)(pbVar5 + lVar11 + 0x18);
  if (3 < lVar22) {
    *puVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    *puVar2 = 0x97;
    sVar24 = ToString(DimensionsTooMany);
    lVar10 = *in_FS_OFFSET;
    iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                     ,0x97);
    uVar16 = (ulong)iVar9;
    pcVar18 = (char *)(lVar10 + -0x700) + uVar16;
    __maxlen = 0x400 - uVar16;
    local_98 = "More than three dimensions in level %d\n";
    goto LAB_001058fa;
  }
  if (lVar22 == 2) {
    if (**(char **)(pbVar5 + lVar11) == (*(char **)(pbVar5 + lVar11))[1]) {
      *puVar1 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      uVar20 = 0x9c;
LAB_00106121:
      *puVar2 = uVar20;
      sVar24 = ToString(DimensionsRepeated);
      lVar10 = *in_FS_OFFSET;
      iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                       (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                       ,uVar20);
      local_98 = "Repeated dimensions on level %d\n";
      snprintf((char *)(lVar10 + -0x700) + iVar9,0x400 - (long)iVar9,
               "Repeated dimensions on level %d\n");
      local_88 = 0x10113;
      goto LAB_00105cae;
    }
  }
  else if (lVar22 == 3) {
    pcVar18 = *(char **)(pbVar5 + lVar11);
    if (((*pcVar18 == pcVar18[1]) || (*pcVar18 == pcVar18[2])) || (pcVar18[1] == pcVar18[2])) {
      *puVar1 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
      ;
      uVar20 = 0x9f;
      goto LAB_00106121;
    }
  }
  else if (lVar22 == 0) {
    *puVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    *puVar2 = 0x99;
    sVar24 = ToString(SyntaxError);
    lVar10 = *in_FS_OFFSET;
    iVar9 = snprintf((char *)(lVar10 + -0x700),0x400,"%.*s (file %s, line %d): ",
                     (ulong)(uint)sVar24.Size,sVar24.field_0.Ptr,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                     ,0x99);
    lVar13 = (long)iVar9;
    pcVar18 = (char *)(lVar10 + -0x700) + lVar13;
    local_98 = ": or | needs to be followed by a dimension in the indexing template\n";
    goto LAB_00105c9f;
  }
  lVar11 = lVar11 + 0x30;
  goto LAB_00105ced;
LAB_00105d61:
  local_48[0] = 1;
  local_48[1] = 1;
  local_48[2] = 1;
  local_48[3] = 1;
  local_48[4] = 1;
  local_48[5] = 1;
  uVar19 = (Idx2->IdxTemplate).Full.Size;
  uVar21 = 0;
  uVar16 = (ulong)uVar19;
  if ((int)uVar19 < 1) {
    uVar16 = uVar21;
  }
  for (; uVar16 != uVar21; uVar21 = uVar21 + 1) {
    iVar14 = (int)(Idx2->IdxTemplate).Full.field_0.Ptr[uVar21];
    iVar9 = isalpha(iVar14);
    if (iVar9 != 0) {
      if (5 < (long)Idx2->CharToIntMap[(long)iVar14 + -0x61]) goto LAB_00106231;
      local_48[Idx2->CharToIntMap[(long)iVar14 + -0x61]] =
           local_48[Idx2->CharToIntMap[(long)iVar14 + -0x61]] << 1;
    }
  }
  lVar10 = 0xd;
  lVar11 = 0;
LAB_00105dd4:
  lVar22 = lVar11;
  if (lVar13 != lVar22) {
    pbVar5 = (Idx2->Dimensions).Buffer.Data;
    uVar16 = *(ulong *)(pbVar5 + lVar10 * 4 + -0x1c);
    if ((long)uVar16 < 1) {
      uVar16 = (ulong)*(uint *)(pbVar5 + lVar10 * 4 + -4);
    }
    iVar9 = 1;
    if ((int)uVar16 != 0) {
      uVar16 = (long)(int)uVar16 - 1;
      lVar11 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      iVar9 = (int)(1L << (-((byte)lVar11 ^ 0x3f) & 0x3f));
      if (uVar16 == 0) {
        iVar9 = 1;
      }
    }
    if (lVar22 == 6) {
LAB_00106231:
      __assert_fail("Idx < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/../Common.h"
                    ,0x2d0,"t &idx2::v6<int>::operator[](int) const [t = int]");
    }
    if (iVar9 <= local_48[lVar22]) goto code_r0x00105e2b;
    *puVar1 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
    ;
    *puVar2 = 0xb6;
    sVar24 = ToString(DimensionMismatched);
    lVar13 = *in_FS_OFFSET;
    iVar14 = snprintf((char *)(lVar13 + -0x700),0x400,"%.*s (file %s, line %d): ",sVar24.Size,
                      sVar24.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                      ,0xb6);
    lVar7 = 0x3f;
    if ((long)iVar9 != 0) {
      for (; (ulong)(long)iVar9 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    bVar4 = pbVar5[lVar10 * 4];
    lVar11 = (long)iVar14;
    pcVar18 = (char *)(lVar13 + -0x700) + lVar11;
    uVar16 = (ulong)local_48[lVar22];
    lVar10 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar19 = (-(uint)(iVar9 == 0) | (uint)lVar7) - (-(uint)(uVar16 == 0) | (uint)lVar10);
    local_98 = "Dimension %c needs to appear %d more times in the indexing template\n";
    goto LAB_00106076;
  }
  *puVar1 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  *puVar2 = 0xca;
  local_98 = "";
  local_88 = 0;
  goto LAB_00105cca;
code_r0x00105e2b:
  lVar10 = lVar10 + 0xe;
  lVar11 = lVar22 + 1;
  if (iVar9 < local_48[lVar22]) goto code_r0x00105e37;
  goto LAB_00105dd4;
code_r0x00105e37:
  *puVar1 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
  *puVar2 = 0xbb;
  sVar24 = ToString(DimensionMismatched);
  lVar13 = *in_FS_OFFSET;
  iVar14 = snprintf((char *)(lVar13 + -0x700),0x400,"%.*s (file %s, line %d): ",sVar24.Size,
                    sVar24.field_0.Ptr,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
                    ,0xbb);
  bVar4 = pbVar5[lVar10 * 4 + -0x38];
  lVar11 = (long)iVar14;
  pcVar18 = (char *)(lVar13 + -0x700) + lVar11;
  uVar16 = (ulong)local_48[lVar22];
  lVar10 = 0x3f;
  if (uVar16 != 0) {
    for (; uVar16 >> lVar10 == 0; lVar10 = lVar10 + -1) {
    }
  }
  lVar13 = 0x3f;
  if ((long)iVar9 != 0) {
    for (; (ulong)(long)iVar9 >> lVar13 == 0; lVar13 = lVar13 + -1) {
    }
  }
  uVar19 = (-(uint)(uVar16 == 0) | (uint)lVar10) - (-(uint)(iVar9 == 0) | (uint)lVar13);
  local_98 = "Dimension %c needs to appear %d fewer times in the indexing template\n";
LAB_00106076:
  snprintf(pcVar18,0x400 - lVar11,local_98,(ulong)(uint)(int)(char)bVar4,(ulong)uVar19);
  local_88 = 0x10105;
LAB_00105cae:
  *(undefined4 *)(lVar6 + -0xfc) = 199;
  *(char **)(lVar15 + -0x2f8) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/v2/idx2Common_v2.cpp"
  ;
LAB_00105cca:
  eVar25.Code = (char)local_88;
  eVar25.StackIdx = (char)((ulong)local_88 >> 8);
  eVar25.StrGened = (bool)(char)((ulong)local_88 >> 0x10);
  eVar25._11_5_ = (int5)((ulong)local_88 >> 0x18);
  eVar25.Msg = local_98;
  return eVar25;
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file_v2* Idx2)
{
  idx2_PropagateIfError(CheckDimensions(Idx2));
  idx2_PropagateIfError(ParseIndexingTemplate(Idx2));
  /* print the parsed indexing template */

  return idx2_Error(idx2_err_code::NoError);
}